

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::ComputeAllConfigSources(cmGeneratorTarget *this)

{
  cmSourceFile *pcVar1;
  cmSourceFile *pcVar2;
  _Base_ptr p_Var3;
  pointer pAVar4;
  iterator __position;
  KindedSources *pKVar5;
  _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_> _Var6;
  _Base_ptr p_Var7;
  pointer pSVar8;
  _Base_ptr p_Var9;
  pair<std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_bool> pVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  AllConfigSource acs;
  value_type entry;
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  unsigned_long local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  value_type local_b8;
  pair<const_cmSourceFile_*const,_unsigned_long> local_90;
  _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  local_80;
  string local_50;
  
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,this->Makefile,&local_d8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0 = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pKVar5 = GetKindedSources(this,local_d8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_e0);
      for (pSVar8 = (pKVar5->Sources).
                    super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar8 != (pKVar5->Sources).
                    super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pSVar8 = pSVar8 + 1) {
        if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0048f123:
          local_b8.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_b8.Source = pSVar8->Source;
          local_b8.Kind = pSVar8->Kind;
          std::
          vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
          ::push_back(&this->AllConfigSources,&local_b8);
          local_90.second =
               ((long)(this->AllConfigSources).
                      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->AllConfigSources).
                      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1;
          local_90.first = pSVar8->Source;
          pVar10 = std::
                   _Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                   ::_M_emplace_unique<std::pair<cmSourceFile_const*const,unsigned_long>&>
                             ((_Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                               *)&local_80,&local_90);
          _Var6 = pVar10.first._M_node;
          if (local_b8.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.Configs.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8.Configs.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.Configs.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          pcVar1 = pSVar8->Source;
          p_Var3 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
          _Var6._M_node = &local_80._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var9 = _Var6._M_node;
            p_Var7 = p_Var3;
            pcVar2 = *(cmSourceFile **)(p_Var7 + 1);
            _Var6._M_node = p_Var7;
            if (pcVar2 < pcVar1) {
              _Var6._M_node = p_Var9;
            }
            p_Var3 = (&p_Var7->_M_left)[pcVar2 < pcVar1];
          } while ((&p_Var7->_M_left)[pcVar2 < pcVar1] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)_Var6._M_node == &local_80._M_impl.super__Rb_tree_header)
          goto LAB_0048f123;
          if (pcVar2 < pcVar1) {
            p_Var7 = p_Var9;
          }
          if (pcVar1 < *(cmSourceFile **)(p_Var7 + 1)) goto LAB_0048f123;
        }
        p_Var3 = _Var6._M_node[1]._M_parent;
        pAVar4 = (this->AllConfigSources).
                 super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current =
             *(pointer *)
              ((long)&pAVar4[(long)p_Var3].Configs.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
        ;
        if (__position._M_current ==
            *(pointer *)
             ((long)&pAVar4[(long)p_Var3].Configs.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
             0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &pAVar4[(long)p_Var3].Configs,__position,&local_e0);
        }
        else {
          *__position._M_current = local_e0;
          *(unsigned_long **)
           ((long)&pAVar4[(long)p_Var3].Configs.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               __position._M_current + 1;
        }
      }
      local_e0 = local_e0 + 1;
    } while (local_e0 <
             (ulong)((long)local_d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeAllConfigSources() const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    KindedSources const& sources = this->GetKindedSources(configs[ci]);
    for (std::vector<cmGeneratorTarget::SourceAndKind>::const_iterator si =
           sources.Sources.begin();
         si != sources.Sources.end(); ++si) {
      std::map<cmSourceFile const*, size_t>::iterator mi =
        index.find(si->Source);
      if (mi == index.end()) {
        AllConfigSource acs;
        acs.Source = si->Source;
        acs.Kind = si->Kind;
        this->AllConfigSources.push_back(acs);
        std::map<cmSourceFile const*, size_t>::value_type entry(
          si->Source, this->AllConfigSources.size() - 1);
        mi = index.insert(entry).first;
      }
      this->AllConfigSources[mi->second].Configs.push_back(ci);
    }
  }
}